

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injection.cpp
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  uint16_t uVar2;
  int __fd;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  ostream *poVar8;
  int iVar9;
  int local_f4;
  uint16_t c2;
  undefined2 uStack_ee;
  int local_ec;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined2 local_dc;
  uint8_t local_da [2];
  undefined2 local_d8;
  ushort local_d6;
  undefined4 local_d4;
  ushort local_d0;
  uchar local_ce [8];
  undefined4 local_c6;
  undefined2 uStack_c2;
  ushort uStack_c0;
  undefined2 local_be;
  char local_bc;
  char local_bb;
  undefined2 local_ba;
  string message;
  array<unsigned_char,_26UL> pseudo;
  uint8_t local_7e [6];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  char local_68 [36];
  sockaddr local_44;
  undefined4 local_34;
  
  __fd = socket(0x11,3,0xff);
  if (__fd < 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1112a);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_78 = 0x6f6c;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    iVar3 = ioctl(__fd,0x8933);
    uVar1 = local_68._0_8_;
    if (iVar3 < 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11162);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    else {
      local_34 = 0;
      local_44.sa_data[6] = '\0';
      local_44.sa_data[7] = '\0';
      local_44.sa_data[8] = '\0';
      local_44.sa_data[9] = '\0';
      local_44.sa_data[10] = '\0';
      local_44.sa_data[0xb] = '\0';
      local_44.sa_data[0xc] = '\0';
      local_44.sa_data[0xd] = '\0';
      local_44.sa_family = 0x11;
      local_44.sa_data[0] = '\0';
      local_44.sa_data[1] = '\x03';
      local_44.sa_data[2] = local_68[0];
      local_44.sa_data[3] = local_68[1];
      local_44.sa_data[4] = local_68[2];
      local_44.sa_data[5] = local_68[3];
      local_68._0_8_ = uVar1;
      iVar3 = bind(__fd,&local_44,0x14);
      if (-1 < iVar3) {
        for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 1) {
          *(undefined1 *)((long)&local_e8 + lVar4) = 0;
        }
        local_e0 = 0;
        local_e8 = 0;
        local_dc = 8;
        local_da[0] = 'E';
        local_d8 = 0x2200;
        local_d4 = 0x11400040;
        builtin_memcpy(local_ce,"(\x02\x02(\x02\x01",8);
        uVar2 = rudp::checksum(local_da,(uint8_t *)&local_c6);
        local_d0 = uVar2 << 8 | uVar2 >> 8;
        for (lVar4 = 0; lVar4 != 0x1a; lVar4 = lVar4 + 1) {
          pseudo._M_elems[lVar4] = '\0';
        }
        pseudo._M_elems[0] = local_ce[0];
        pseudo._M_elems[1] = local_ce[1];
        pseudo._M_elems[2] = local_ce[2];
        pseudo._M_elems[3] = local_ce[3];
        pseudo._M_elems[4] = local_ce[4];
        pseudo._M_elems[5] = local_ce[5];
        pseudo._M_elems[6] = local_ce[6];
        pseudo._M_elems[7] = local_ce[7];
        pseudo._M_elems[9] = local_d4._3_1_;
        pseudo._M_elems[10] = '\0';
        pseudo._M_elems[0xb] = '\x0e';
        local_c6 = 0x401f401f;
        uStack_c2 = 0xe00;
        iVar9 = 0;
        local_f4 = 0;
        local_ec = iVar3;
        do {
          if (iVar9 == 0x100) {
            close(__fd);
            return 1;
          }
          local_be = 0x650;
          local_bc = (char)iVar9;
          local_bb = local_bc + -1;
          _c2 = 0;
          message._M_dataplus._M_p = (pointer)&local_ba;
          boost::spirit::karma::
          generate<unsigned_char*,boost::spirit::terminal<boost::spirit::tag::big_word>,int>
                    ((uchar **)&message,
                     (terminal<boost::spirit::tag::big_word> *)&boost::spirit::big_word,(int *)&c2);
          uVar2 = rudp::checksum((uint8_t *)&local_be,(uint8_t *)&message);
          _c2 = CONCAT22(uStack_ee,uVar2);
          message._M_dataplus._M_p = (pointer)&local_ba;
          boost::spirit::karma::
          generate<unsigned_char*,boost::spirit::terminal<boost::spirit::tag::big_word>,unsigned_short>
                    ((uchar **)&message,
                     (terminal<boost::spirit::tag::big_word> *)&boost::spirit::big_word,&c2);
          uStack_c0 = 0;
          pseudo._M_elems._16_2_ = uStack_c2;
          pseudo._M_elems._12_4_ = local_c6;
          pseudo._M_elems[0x16] = local_bc;
          pseudo._M_elems._20_2_ = local_be;
          pseudo._M_elems[0x17] = local_bb;
          pseudo._M_elems._24_2_ = local_ba;
          pseudo._M_elems[0x12] = '\0';
          pseudo._M_elems[0x13] = '\0';
          uVar2 = rudp::checksum(pseudo._M_elems,local_7e);
          uStack_c0 = uVar2 << 8 | uVar2 >> 8;
          local_d6 = (ushort)iVar9 << 8 | (ushort)iVar9 >> 8;
          local_d0 = 0;
          uVar2 = rudp::checksum(local_da,(uint8_t *)&local_c6);
          local_d0 = uVar2 << 8 | uVar2 >> 8;
          message._M_dataplus._M_p = (pointer)&message.field_2;
          message._M_string_length = 0;
          message.field_2._M_local_buf[0] = '\0';
          sVar5 = write(__fd,&local_e8,0x30);
          if (sVar5 < 0) {
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            poVar8 = std::operator<<((ostream *)&std::cout,pcVar7);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_111b6);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_ec);
            std::endl<char,std::char_traits<char>>(poVar8);
            close(__fd);
            local_f4 = 1;
          }
          std::__cxx11::string::~string((string *)&message);
          iVar9 = iVar9 + 1;
        } while (-1 < sVar5);
        return local_f4;
      }
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      poVar8 = std::operator<<((ostream *)&std::cout,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_11178);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    close(__fd);
  }
  return 1;
}

Assistant:

int main() {
  int sock = socket( AF_PACKET, SOCK_RAW, IPPROTO_RAW );
  if (sock < 0) {
    std::cout << "ソケットを開けない" << std::endl;
    return 1;
  }
  ifreq interface;
  memset( &interface, 0, sizeof( interface ) );
  strncpy( interface.ifr_name, "lo", IFNAMSIZ );
  if( ioctl( sock, SIOCGIFINDEX, &interface ) < 0 ) {
    std::cout << "インターフェースが見つからない" << std::endl;
    close( sock );
    return 1;
  }
  sockaddr_ll source_addr;
  memset( &source_addr, 0, sizeof( sockaddr_ll ) );
  source_addr.sll_family = AF_PACKET;
  source_addr.sll_protocol = htons( ETH_P_ALL );
  source_addr.sll_ifindex = interface.ifr_ifindex;
  const auto bind_result = bind( sock, reinterpret_cast< sockaddr* >( &source_addr ), sizeof( sockaddr_ll ) );
  if( bind_result < 0 ) {
    std::cout << strerror( errno ) << std::endl;
    std::cout << "bindできない " << bind_result << std::endl;
    close( sock );
    return 1;
  }
  constexpr size_t ether_header_size = 14;
  constexpr size_t ip_header_size = 20;
  constexpr size_t udp_header_size = 8;
  constexpr size_t rudp_header_size = 6;
  constexpr size_t pseudo_header_size = 12;
  constexpr size_t ether_offset = 0;
  constexpr size_t ip_offset = ether_header_size;
  constexpr size_t udp_offset = ip_offset + ip_header_size;
  constexpr size_t rudp_offset = udp_offset + udp_header_size;
  constexpr size_t total_packet_size = rudp_offset + rudp_header_size;
  constexpr size_t pseudo_ip_offset = 0;
  constexpr size_t pseudo_udp_offset = pseudo_ip_offset + pseudo_header_size;
  constexpr size_t pseudo_rudp_offset = pseudo_udp_offset + udp_header_size;
  constexpr size_t total_pseudo_packet_size = pseudo_rudp_offset + rudp_header_size;
  constexpr size_t ether_payload_size = ip_header_size + udp_header_size + rudp_header_size;
  constexpr size_t ip_payload_size = udp_header_size + rudp_header_size;
  constexpr size_t udp_payload_size = rudp_header_size;
  namespace karma = boost::spirit::karma;
  std::array< uint8_t, total_packet_size > buf;
  std::fill( buf.begin(), buf.end(), 0 );
  std::array< uint8_t, 6 > mac{ 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
  std::copy( mac.begin(), mac.end(), buf.begin() );
  std::copy( mac.begin(), mac.end(), std::next( buf.begin(), 6 ) );
  buf[ 12 ] = 0x08;
  buf[ 13 ] = 0x00;ether_payload_size & 0xFF;
  auto ip_header = reinterpret_cast< iphdr* >( std::next( buf.data(), ip_offset ) );
  ip_header->version = 4;
  ip_header->ihl = 5;
  ip_header->tot_len = htons( ether_payload_size );
  ip_header->ttl = 0x40;
  ip_header->protocol = 0x11;
  ip_header->frag_off = htons( 0x02 << 13 );
  ip_header->saddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 2 );
  ip_header->daddr = htonl( ( 192 << 24 ) | ( 168 << 16 ) | ( 2 << 8 ) | 1 );
  uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
  ip_header->check = htons( c0 );
  std::array< uint8_t, total_pseudo_packet_size > pseudo;
  std::fill( pseudo.begin(), pseudo.end(), 0 );
  auto pseudo_header = reinterpret_cast< pseudo_header_t* >( std::next( pseudo.data(), pseudo_ip_offset ) );
  pseudo_header->saddr = ip_header->saddr;
  pseudo_header->daddr = ip_header->daddr;
  pseudo_header->protocol = ip_header->protocol;
  pseudo_header->tot_len = htons( udp_header_size + rudp_header_size );
  auto udp_header = reinterpret_cast< udphdr* >( std::next( buf.data(), udp_offset ) );
  udp_header->uh_sport = htons( port );
  udp_header->uh_dport = htons( port );
  udp_header->uh_ulen = htons( udp_header_size + rudp_header_size );
  auto rudp_header = std::next( buf.begin(), rudp_offset );
  for( unsigned int seq = 0; seq != 256u; ++seq ) {
    rudp_header[ 0 ] = 0x50;
    rudp_header[ 1 ] = 0x06;
    rudp_header[ 2 ] = uint8_t( seq );
    rudp_header[ 3 ] = uint8_t( seq - 1 );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, 0x0000 );
    uint16_t c2 = rudp::checksum( rudp_header, buf.end() );
    karma::generate( std::next( rudp_header, 4 ), karma::big_word, c2 );
    udp_header->uh_sum = 0;
    std::copy( std::next( buf.begin(), udp_offset ), buf.end(), std::next( pseudo.begin(), pseudo_udp_offset ) );
    uint16_t c1 = rudp::checksum( pseudo.begin(), pseudo.end() );
    udp_header->uh_sum = htons( c1 );
    ip_header->id = htons( seq );
    ip_header->check = 0;
    uint16_t c0 = rudp::checksum( std::next( buf.begin(), ip_offset ), std::next( buf.begin(), ip_offset + ip_header_size ) );
    ip_header->check = htons( c0 );
    std::string message;
    if( write( sock, buf.data(), buf.size() ) < 0 ) {
      std::cout << strerror( errno ) << std::endl;
      std::cout << "送信できない " << bind_result << std::endl;
      close( sock );
      return 1;
    }
  }
  close( sock );
  return 1;
}